

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

visplane_t * swrenderer::new_visplane(uint hash)

{
  visplane_t *pvVar1;
  visplane_t *__s;
  
  if (freetail == (visplane_t *)0x0) {
    __s = (visplane_t *)
          M_Malloc_Dbg(0x5ae3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_plane.cpp"
                       ,0x159);
    memset(__s,0,0x5ae3);
    __s->bottom = (unsigned_short *)((long)&__s[0x34].height.normal.Y + 6);
    pvVar1 = freetail;
  }
  else {
    pvVar1 = freetail->next;
    __s = freetail;
    if (pvVar1 == (visplane_t *)0x0) {
      freehead = (undefined *)&freetail;
    }
  }
  freetail = pvVar1;
  __s->next = (visplane_s *)(&visplanes)[hash];
  (&visplanes)[hash] = __s;
  return __s;
}

Assistant:

static visplane_t *new_visplane (unsigned hash)
{
	visplane_t *check = freetail;

	if (check == NULL)
	{
		check = (visplane_t *)M_Malloc (sizeof(*check) + 3 + sizeof(*check->top)*(MAXWIDTH*2));
		memset(check, 0, sizeof(*check) + 3 + sizeof(*check->top)*(MAXWIDTH*2));
		check->bottom = check->top + MAXWIDTH+2;
	}
	else if (NULL == (freetail = freetail->next))
	{
		freehead = &freetail;
	}

	check->next = visplanes[hash];
	visplanes[hash] = check;
	return check;
}